

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O0

void __thiscall Steiner::plot(Steiner *this,string *plotName)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<Point,_std::allocator<Point>_> *this_00;
  string *in_RSI;
  long in_RDI;
  reference rVar10;
  uint i_5;
  Point *p2_2;
  Point *p1_2;
  uint i_4;
  uint i_3;
  Point *p2_1;
  Point *p1_1;
  uint i_2;
  Point *p2;
  Point *p1;
  uint i_1;
  int i;
  int idx;
  ofstream of;
  string ofileName;
  size_type in_stack_fffffffffffff9b8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff9c0;
  uint local_29c;
  reference local_288;
  uint local_278;
  uint local_274;
  reference local_270;
  reference local_268;
  uint local_25c;
  reference local_258;
  reference local_250;
  uint local_248;
  int local_244;
  int local_240;
  ostream local_230 [512];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  std::ofstream::ofstream(local_230,local_30,_S_out);
  poVar3 = std::operator<<(local_230,"set size ratio -1");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_230,"set nokey");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_230,"set xrange[");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)(*(int *)(in_RDI + 0x24) - *(int *)(in_RDI + 0x20)) * -0.05);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)(*(int *)(in_RDI + 0x24) - *(int *)(in_RDI + 0x20)) * 1.05);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_230,"set yrange[");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)(*(int *)(in_RDI + 0x28) - *(int *)(in_RDI + 0x2c)) * -0.05);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)(*(int *)(in_RDI + 0x28) - *(int *)(in_RDI + 0x2c)) * 1.05);
  poVar3 = std::operator<<(poVar3,"]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_240 = 1;
  poVar3 = std::operator<<(local_230,"set object ");
  iVar1 = local_240;
  local_240 = local_240 + 1;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," rect from ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x20));
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x2c));
  poVar3 = std::operator<<(poVar3," to ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x24));
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x28));
  std::operator<<(poVar3,"fc rgb \"grey\" behind\n");
  for (local_244 = 0; local_244 < *(int *)(in_RDI + 0x30); local_244 = local_244 + 1) {
    poVar3 = std::operator<<(local_230,"set object circle at first ");
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)local_244);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)local_244);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    poVar3 = std::operator<<(poVar3," radius char 0.3 fillstyle solid ");
    std::operator<<(poVar3,"fc rgb \"red\" front\n");
  }
  for (local_248 = 0; uVar5 = (ulong)local_248,
      sVar6 = std::vector<Edge,_std::allocator<Edge>_>::size
                        ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1d0)), uVar5 < sVar6;
      local_248 = local_248 + 1) {
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1d0),(ulong)local_248);
    local_250 = std::vector<Point,_std::allocator<Point>_>::operator[]
                          ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1
                          );
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1d0),(ulong)local_248);
    local_258 = std::vector<Point,_std::allocator<Point>_>::operator[]
                          ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2
                          );
    poVar3 = std::operator<<(local_230,"set arrow ");
    iVar1 = local_240;
    local_240 = local_240 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250->x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250->y);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_258->x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_258->y);
    std::operator<<(poVar3," nohead lc rgb \"white\" lw 1 front\n");
  }
  for (local_25c = 0; uVar5 = (ulong)local_25c,
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e8)), uVar5 < sVar6;
      local_25c = local_25c + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e8),(ulong)local_25c);
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1d0),(long)*pvVar8);
    local_268 = std::vector<Point,_std::allocator<Point>_>::operator[]
                          ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1
                          );
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1e8),(ulong)local_25c);
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1d0),(long)*pvVar8);
    local_270 = std::vector<Point,_std::allocator<Point>_>::operator[]
                          ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2
                          );
    poVar3 = std::operator<<(local_230,"set arrow ");
    iVar1 = local_240;
    local_240 = local_240 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268->x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_268->y);
    poVar3 = std::operator<<(poVar3," to ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_270->x);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_270->y);
    std::operator<<(poVar3," nohead lc rgb \"blue\" lw 1 front\n");
  }
  local_274 = *(uint *)(in_RDI + 0x30);
  while( true ) {
    uVar5 = (ulong)local_274;
    sVar6 = std::vector<Point,_std::allocator<Point>_>::size
                      ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38));
    if (sVar6 <= uVar5) break;
    poVar3 = std::operator<<(local_230,"set object circle at first ");
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(ulong)local_274);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(ulong)local_274);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    poVar3 = std::operator<<(poVar3," radius char 0.3 fillstyle solid ");
    std::operator<<(poVar3,"fc rgb \"yellow\" front\n");
    local_274 = local_274 + 1;
  }
  local_278 = 0;
  while( true ) {
    uVar5 = (ulong)local_278;
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80));
    if (sVar6 <= uVar5) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_278);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_288 = rVar10;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_278);
      pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x50),(long)*pvVar8);
      pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1)
      ;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(ulong)local_278);
      pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x50),(long)*pvVar8);
      pvVar9 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2)
      ;
      if (pvVar4->x != pvVar9->x) {
        poVar3 = std::operator<<(local_230,"set arrow ");
        iVar1 = local_240;
        local_240 = local_240 + 1;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3," from ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
        poVar3 = std::operator<<(poVar3," to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar9->x);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
        std::operator<<(poVar3," nohead lc rgb \"black\" lw 1.5 front\n");
      }
      if (pvVar4->y != pvVar9->y) {
        poVar3 = std::operator<<(local_230,"set arrow ");
        iVar1 = local_240;
        local_240 = local_240 + 1;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3," from ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar9->x);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
        poVar3 = std::operator<<(poVar3," to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar9->x);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar9->y);
        std::operator<<(poVar3," nohead lc rgb \"black\" lw 1.5 front\n");
      }
    }
    local_278 = local_278 + 1;
  }
  local_29c = 0;
  while( true ) {
    sVar6 = std::vector<Edge,_std::allocator<Edge>_>::size
                      ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8));
    if (sVar6 <= local_29c) break;
    poVar3 = std::operator<<(local_230,"set arrow ");
    iVar1 = local_240;
    local_240 = local_240 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," from ");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    poVar3 = std::operator<<(poVar3," to ");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    std::operator<<(poVar3," nohead lc rgb \"black\" lw 1.5 front\n");
    poVar3 = std::operator<<(local_230,"set arrow ");
    iVar1 = local_240;
    local_240 = local_240 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3," from ");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    poVar3 = std::operator<<(poVar3," to ");
    this_00 = (vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38);
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[](this_00,(long)pvVar7->p2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->x);
    poVar3 = std::operator<<(poVar3,",");
    pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 0x1a8),(ulong)local_29c);
    pvVar4 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)(in_RDI + 0x38),(long)pvVar7->p2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->y);
    std::operator<<(poVar3," nohead lc rgb \"black\" lw 1.5 front\n");
    local_29c = local_29c + 1;
  }
  poVar3 = std::operator<<(local_230,"plot 1000000000");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_230,"pause -1 \'Press any key\'");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_230);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Steiner::plot(const string& plotName) {
  string ofileName = plotName;
  ofstream of(ofileName, ofstream::out);
  of << "set size ratio -1" << endl;
  of << "set nokey" << endl;
  of << "set xrange["
     << (_boundaryRight - _boundaryLeft) * -0.05 << ":"
     << (_boundaryRight - _boundaryLeft) * 1.05 << "]" << endl;
  of << "set yrange["
     << (_boundaryTop - _boundaryBottom) * -0.05 << ":"
     << (_boundaryTop - _boundaryBottom) * 1.05 << "]" << endl;
  int idx = 1;
  of << "set object " << idx++ << " rect from "
     << _boundaryLeft << "," << _boundaryBottom << " to "
     << _boundaryRight << "," << _boundaryTop << "fc rgb \"grey\" behind\n";
  // point
  for (int i = 0; i < _init_p; ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"red\" front\n";
  }
  // RSG
  for (unsigned i = 0; i < _init_edges.size(); ++i) {
    Point& p1 = _points[_init_edges[i].p1];
    Point& p2 = _points[_init_edges[i].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"white\" lw 1 front\n";
  }
  // MST
  for (unsigned i = 0; i < _init_MST.size(); ++i) {
    Point& p1 = _points[_init_edges[_init_MST[i]].p1];
    Point& p2 = _points[_init_edges[_init_MST[i]].p2];
    of << "set arrow " << idx++ << " from "
       << p1.x << "," << p1.y << " to "
       << p2.x << "," << p2.y
       << " nohead lc rgb \"blue\" lw 1 front\n";
  }
  // s-point
  for (unsigned i = _init_p; i < _points.size(); ++i) {
    of << "set object circle at first " << _points[i].x << ","
       << _points[i].y << " radius char 0.3 fillstyle solid "
       << "fc rgb \"yellow\" front\n";
  }
  // RST
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "set arrow " << idx++ << " from "
        << p1.x << "," << p1.y << " to "
        << p2.x << "," << p1.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
    if (p1.y != p2.y) {
      of << "set arrow " << idx++ << " from "
        << p2.x << "," << p1.y << " to "
        << p2.x << "," << p2.y
        << " nohead lc rgb \"black\" lw 1.5 front\n";
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p1].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
    of << "set arrow " << idx++ << " from "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p1].y << " to "
       << _points[_newE[i].p2].x << "," << _points[_newE[i].p2].y
       << " nohead lc rgb \"black\" lw 1.5 front\n";
  }
  of << "plot 1000000000" << endl;
  of << "pause -1 'Press any key'" << endl;
  of.close();
}